

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall
IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
          (ByteCodeUsesInstr *this,bool isJITOptimizedReg,uint symId)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,isJITOptimizedReg) == 0) {
    if (this->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
               new<Memory::JitArenaAllocator>(0x20,((this->super_Instr).m_func)->m_alloc,0x3f1274);
      pJVar1 = ((this->super_Instr).m_func)->m_alloc;
      pBVar5->head = (Type_conflict)0x0;
      pBVar5->lastFoundIndex = (Type_conflict)0x0;
      pBVar5->alloc = pJVar1;
      pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
      this->byteCodeUpwardExposedUsed = pBVar5;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(this->byteCodeUpwardExposedUsed,symId);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                     ,0x3af,"(false)",
                     "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
  if (bVar3) {
    *puVar4 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeUsesInstr::SetRemovedOpndSymbol(bool isJITOptimizedReg, uint symId)
{
    if (isJITOptimizedReg)
    {
        AssertMsg(false, "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
        // Although we assert on debug builds, we should actually be ok with release builds
        // if we ignore the operand; not ignoring it, however, can cause us to introduce an
        // inconsistency in bytecode register lifetimes.
        return;
    }
    if(!this->byteCodeUpwardExposedUsed)
    {
        this->byteCodeUpwardExposedUsed = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
    }
    this->byteCodeUpwardExposedUsed->Set(symId);
}